

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomCamera *camera,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *this_00;
  TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
  *this_01;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *pTVar3;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_> *attr;
  TypedAttributeWithFallback<tinyusdz::GeomCamera::StereoRole> *attr_00;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *pTVar4;
  uint32_t indent_00;
  string *psVar5;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  undefined3 in_register_00000081;
  uint32_t indent_01;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  allocator local_579;
  string local_578;
  string local_558;
  allocator local_531;
  string local_530;
  string local_510;
  allocator local_4e9;
  string local_4e8;
  string local_4c8;
  allocator local_4a1;
  string local_4a0;
  string local_480;
  allocator local_459;
  string local_458;
  string local_438;
  allocator local_411;
  string local_410;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  string local_3a8;
  allocator local_381;
  string local_380;
  string local_360;
  allocator local_339;
  string local_338;
  string local_318;
  allocator local_2f1;
  undefined1 local_2f0 [32];
  string local_2d0;
  allocator local_2a9;
  undefined1 local_2a8 [32];
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  GeomCamera *pGStack_18;
  uint32_t indent_local;
  GeomCamera *camera_local;
  
  indent_01 = CONCAT31(in_register_00000081,closing_brace);
  local_1c = (uint)camera;
  local_1d = (byte)indent & 1;
  psVar5 = __return_storage_ptr__;
  pGStack_18 = (GeomCamera *)this;
  camera_local = (GeomCamera *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar5;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)(pGStack_18->super_GPrim).spec,s);
  poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = std::operator<<(poVar2," Camera \"");
  poVar2 = std::operator<<(poVar2,(string *)&(pGStack_18->super_GPrim).name);
  std::operator<<(poVar2,"\"\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored(&(pGStack_18->super_GPrim).meta);
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_208);
    std::operator<<(poVar2,"(\n");
    std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)&(pGStack_18->super_GPrim).meta,
               (PrimMeta *)(ulong)(local_1c + 1),indent_00);
    std::operator<<(aoStack_198,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_248);
    std::operator<<(poVar2,")\n");
    std::__cxx11::string::~string((string *)&local_248);
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,n_02);
  poVar2 = std::operator<<(aoStack_198,(string *)&local_268);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::~string((string *)&local_268);
  this_00 = &pGStack_18->clippingRange;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_2a8,"clippingRange",&local_2a9);
  print_typed_attr<std::array<float,2ul>>
            ((string *)(local_2a8 + 0x20),(tinyusdz *)this_00,
             (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_2a8
             ,(string *)(ulong)(local_1c + 1),indent_01);
  std::operator<<(aoStack_198,(string *)(local_2a8 + 0x20));
  std::__cxx11::string::~string((string *)(local_2a8 + 0x20));
  std::__cxx11::string::~string((string *)local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  this_01 = &pGStack_18->clippingPlanes;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_2f0,"clippingPlanes",&local_2f1);
  print_typed_attr<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
            ((string *)(local_2f0 + 0x20),(tinyusdz *)this_01,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
              *)local_2f0,(string *)(ulong)(local_1c + 1),indent_01);
  std::operator<<(aoStack_198,(string *)(local_2f0 + 0x20));
  std::__cxx11::string::~string((string *)(local_2f0 + 0x20));
  std::__cxx11::string::~string((string *)local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  pTVar3 = &pGStack_18->focalLength;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_338,"focalLength",&local_339);
  print_typed_attr<float>(&local_318,pTVar3,&local_338,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  pTVar3 = &pGStack_18->horizontalAperture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"horizontalAperture",&local_381);
  print_typed_attr<float>(&local_360,pTVar3,&local_380,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  pTVar3 = &pGStack_18->horizontalApertureOffset;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c8,"horizontalApertureOffset",&local_3c9);
  print_typed_attr<float>(&local_3a8,pTVar3,&local_3c8,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  pTVar3 = &pGStack_18->verticalAperture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"verticalAperture",&local_411);
  print_typed_attr<float>(&local_3f0,pTVar3,&local_410,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  pTVar3 = &pGStack_18->verticalApertureOffset;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"verticalApertureOffset",&local_459);
  print_typed_attr<float>(&local_438,pTVar3,&local_458,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  attr = &pGStack_18->projection;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a0,"projection",&local_4a1);
  print_typed_token_attr<tinyusdz::GeomCamera::Projection>(&local_480,attr,&local_4a0,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  attr_00 = &pGStack_18->stereoRole;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e8,"stereoRole",&local_4e9);
  print_typed_token_attr<tinyusdz::GeomCamera::StereoRole>
            (&local_4c8,attr_00,&local_4e8,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  pTVar4 = &pGStack_18->shutterOpen;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_530,"shutter:open",&local_531);
  print_typed_attr<double>(&local_510,pTVar4,&local_530,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  pTVar4 = &pGStack_18->shutterClose;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_578,"shutter:close",&local_579);
  print_typed_attr<double>(&local_558,pTVar4,&local_578,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  print_gprim_predefined<tinyusdz::GeomCamera>(&local_5a0,pGStack_18,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_5a0);
  print_props(&local_5c0,&(pGStack_18->super_GPrim).props,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_5e0,(pprint *)(ulong)local_1c,n_03);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_5e0);
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_5e0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomCamera &camera, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(camera.spec) << " Camera \""
     << camera.name << "\"\n";
  if (camera.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(camera.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(camera.clippingRange, "clippingRange", indent + 1);
  ss << print_typed_attr(camera.clippingPlanes, "clippingPlanes", indent + 1);
  ss << print_typed_attr(camera.focalLength, "focalLength", indent + 1);
  ss << print_typed_attr(camera.horizontalAperture, "horizontalAperture",
                         indent + 1);
  ss << print_typed_attr(camera.horizontalApertureOffset,
                         "horizontalApertureOffset", indent + 1);
  ss << print_typed_attr(camera.verticalAperture, "verticalAperture",
                         indent + 1);
  ss << print_typed_attr(camera.verticalApertureOffset,
                         "verticalApertureOffset", indent + 1);

  ss << print_typed_token_attr(camera.projection, "projection", indent + 1);
  ss << print_typed_token_attr(camera.stereoRole, "stereoRole", indent + 1);

  ss << print_typed_attr(camera.shutterOpen, "shutter:open", indent + 1);
  ss << print_typed_attr(camera.shutterClose, "shutter:close", indent + 1);

  ss << print_gprim_predefined(camera, indent + 1);

  ss << print_props(camera.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}